

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O1

void __thiscall CoinSelection_Constructor_Test::TestBody(CoinSelection_Constructor_Test *this)

{
  bool bVar1;
  CoinSelection coin_select1;
  AssertHelper local_40;
  long *local_38;
  _Bit_type *local_30;
  uint local_28;
  _Bit_type *local_20;
  uint local_18;
  _Bit_pointer local_10;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if ((bVar1) &&
       (cfd::CoinSelection::CoinSelection((CoinSelection *)&local_38), local_30 != (_Bit_type *)0x0)
       ) {
      operator_delete(local_30);
      local_30 = (_Bit_type *)0x0;
      local_28 = 0;
      local_20 = (_Bit_type *)0x0;
      local_18 = 0;
      local_10 = (_Bit_pointer)0x0;
    }
  }
  else {
    testing::Message::Message((Message *)&local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x27b,
               "Expected: CoinSelection coin_select1 doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_38 + 8))();
      }
      local_38 = (long *)0x0;
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if ((bVar1) &&
       (cfd::CoinSelection::CoinSelection((CoinSelection *)&local_38,false),
       local_30 != (_Bit_type *)0x0)) {
      operator_delete(local_30);
    }
  }
  else {
    testing::Message::Message((Message *)&local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x27c,
               "Expected: CoinSelection coin_select2(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*local_38 + 8))();
    }
  }
  return;
}

Assistant:

TEST(CoinSelection, Constructor)
{
  EXPECT_NO_THROW(CoinSelection coin_select1);
  EXPECT_NO_THROW(CoinSelection coin_select2(false));
}